

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_xonly_pubkey_tweak_add
              (secp256k1_context *ctx,secp256k1_pubkey *output_pubkey,
              secp256k1_xonly_pubkey *internal_pubkey,uchar *tweak32)

{
  int iVar1;
  secp256k1_ge pk;
  secp256k1_ge local_70;
  
  if (output_pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_xonly_pubkey_tweak_add_cold_3();
  }
  else {
    output_pubkey->data[0x30] = '\0';
    output_pubkey->data[0x31] = '\0';
    output_pubkey->data[0x32] = '\0';
    output_pubkey->data[0x33] = '\0';
    output_pubkey->data[0x34] = '\0';
    output_pubkey->data[0x35] = '\0';
    output_pubkey->data[0x36] = '\0';
    output_pubkey->data[0x37] = '\0';
    output_pubkey->data[0x38] = '\0';
    output_pubkey->data[0x39] = '\0';
    output_pubkey->data[0x3a] = '\0';
    output_pubkey->data[0x3b] = '\0';
    output_pubkey->data[0x3c] = '\0';
    output_pubkey->data[0x3d] = '\0';
    output_pubkey->data[0x3e] = '\0';
    output_pubkey->data[0x3f] = '\0';
    output_pubkey->data[0x20] = '\0';
    output_pubkey->data[0x21] = '\0';
    output_pubkey->data[0x22] = '\0';
    output_pubkey->data[0x23] = '\0';
    output_pubkey->data[0x24] = '\0';
    output_pubkey->data[0x25] = '\0';
    output_pubkey->data[0x26] = '\0';
    output_pubkey->data[0x27] = '\0';
    output_pubkey->data[0x28] = '\0';
    output_pubkey->data[0x29] = '\0';
    output_pubkey->data[0x2a] = '\0';
    output_pubkey->data[0x2b] = '\0';
    output_pubkey->data[0x2c] = '\0';
    output_pubkey->data[0x2d] = '\0';
    output_pubkey->data[0x2e] = '\0';
    output_pubkey->data[0x2f] = '\0';
    output_pubkey->data[0x10] = '\0';
    output_pubkey->data[0x11] = '\0';
    output_pubkey->data[0x12] = '\0';
    output_pubkey->data[0x13] = '\0';
    output_pubkey->data[0x14] = '\0';
    output_pubkey->data[0x15] = '\0';
    output_pubkey->data[0x16] = '\0';
    output_pubkey->data[0x17] = '\0';
    output_pubkey->data[0x18] = '\0';
    output_pubkey->data[0x19] = '\0';
    output_pubkey->data[0x1a] = '\0';
    output_pubkey->data[0x1b] = '\0';
    output_pubkey->data[0x1c] = '\0';
    output_pubkey->data[0x1d] = '\0';
    output_pubkey->data[0x1e] = '\0';
    output_pubkey->data[0x1f] = '\0';
    output_pubkey->data[0] = '\0';
    output_pubkey->data[1] = '\0';
    output_pubkey->data[2] = '\0';
    output_pubkey->data[3] = '\0';
    output_pubkey->data[4] = '\0';
    output_pubkey->data[5] = '\0';
    output_pubkey->data[6] = '\0';
    output_pubkey->data[7] = '\0';
    output_pubkey->data[8] = '\0';
    output_pubkey->data[9] = '\0';
    output_pubkey->data[10] = '\0';
    output_pubkey->data[0xb] = '\0';
    output_pubkey->data[0xc] = '\0';
    output_pubkey->data[0xd] = '\0';
    output_pubkey->data[0xe] = '\0';
    output_pubkey->data[0xf] = '\0';
    if (internal_pubkey == (secp256k1_xonly_pubkey *)0x0) {
      secp256k1_xonly_pubkey_tweak_add_cold_2();
    }
    else {
      if (tweak32 != (uchar *)0x0) {
        iVar1 = secp256k1_pubkey_load(ctx,&local_70,(secp256k1_pubkey *)internal_pubkey);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = secp256k1_ec_pubkey_tweak_add_helper(&local_70,tweak32);
        if (iVar1 == 0) {
          return 0;
        }
        secp256k1_pubkey_save(output_pubkey,&local_70);
        return 1;
      }
      secp256k1_xonly_pubkey_tweak_add_cold_1();
    }
  }
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_tweak_add(const secp256k1_context* ctx, secp256k1_pubkey *output_pubkey, const secp256k1_xonly_pubkey *internal_pubkey, const unsigned char *tweak32) {
    secp256k1_ge pk;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output_pubkey != NULL);
    memset(output_pubkey, 0, sizeof(*output_pubkey));
    ARG_CHECK(internal_pubkey != NULL);
    ARG_CHECK(tweak32 != NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, internal_pubkey)
        || !secp256k1_ec_pubkey_tweak_add_helper(&pk, tweak32)) {
        return 0;
    }
    secp256k1_pubkey_save(output_pubkey, &pk);
    return 1;
}